

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsLink.cpp
# Opt level: O1

bool Js::ASMLink::CheckFFI(ScriptContext *scriptContext,AsmJsModuleInfo *info,Var foreign)

{
  TypeId typeId;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RecyclableObject *pRVar4;
  
  if ((info->mFunctionImportCount == 0) && (info->mVarImportCount == 0)) {
    bVar2 = true;
  }
  else {
    if (foreign == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsLink.cpp"
                                  ,0x2c,"(foreign)","foreign");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    bVar2 = VarIs<Js::RecyclableObject>(foreign);
    if (bVar2) {
      pRVar4 = VarTo<Js::RecyclableObject>(foreign);
      typeId = ((pRVar4->type).ptr)->typeId;
      bVar2 = StaticType::Is(typeId);
      if (typeId == TypeIds_Proxy || bVar2) {
        AsmJSCompiler::OutputError(scriptContext,L"Asm.js Runtime Error : FFI is not an object");
      }
      bVar2 = typeId != TypeIds_Proxy && !bVar2;
    }
    else {
      bVar2 = false;
      AsmJSCompiler::OutputError(scriptContext,L"Asm.js Runtime Error : FFI is not an object");
    }
  }
  return bVar2;
}

Assistant:

bool ASMLink::CheckFFI(ScriptContext* scriptContext, AsmJsModuleInfo* info, const Var foreign)
    {
        if (info->GetFunctionImportCount() == 0 && info->GetVarImportCount() == 0)
        {
            return true;
        }
        Assert(foreign);
        if (!VarIs<RecyclableObject>(foreign))
        {
            AsmJSCompiler::OutputError(scriptContext, _u("Asm.js Runtime Error : FFI is not an object"));
            return false;
        }
        TypeId foreignObjType = VarTo<RecyclableObject>(foreign)->GetTypeId();
        if (StaticType::Is(foreignObjType) || TypeIds_Proxy == foreignObjType)
        {
            AsmJSCompiler::OutputError(scriptContext, _u("Asm.js Runtime Error : FFI is not an object"));
            return false;
        }
        return true;
    }